

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

Hypothesis *
sentencepiece::unigram::anon_unknown_0::CloneHypAndDependents
          (Hypothesis *to_clone,flat_hash_map<const_Hypothesis_*,_Hypothesis_*> *clone_map,
          FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis> *allocator)

{
  float fVar1;
  bool bVar2;
  pointer ppVar3;
  unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
  *in_RSI;
  Hypothesis *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_false,_false>,_bool>
  pVar4;
  Hypothesis *new_hyp;
  iterator iter;
  Hypothesis **result_callback;
  Hypothesis *cloned;
  unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis> *in_stack_ffffffffffffffb0;
  Hypothesis *local_40;
  _Node_iterator_base<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_false>
  local_30;
  Hypothesis **local_28;
  Hypothesis *local_20 [2];
  unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
  *local_10;
  Hypothesis *local_8;
  
  local_20[0] = (Hypothesis *)0x0;
  local_28 = local_20;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (local_8 == (Hypothesis *)0x0) {
      return local_20[0];
    }
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
         ::find(in_stack_ffffffffffffff98,(key_type *)0x481131);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar2 = std::__detail::operator!=(&local_30,&local_38);
    if (bVar2) break;
    local_40 = model::FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis>::Allocate
                         (in_stack_ffffffffffffffb0);
    local_40->node = local_8->node;
    local_40->next = local_8->next;
    fVar1 = local_8->gx;
    local_40->fx = local_8->fx;
    local_40->gx = fVar1;
    *local_28 = local_40;
    in_stack_ffffffffffffff98 = local_10;
    std::
    pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>
    ::
    pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*&,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*&,_true>
              ((pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>
                *)&stack0xffffffffffffffb0,&local_8,&local_40);
    pVar4 = std::
            unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
            ::insert((unordered_map<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::hash<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::equal_to<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_std::allocator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>_>
                      *)in_stack_ffffffffffffffb0,
                     (value_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffffa8 = pVar4.second;
    local_8 = local_8->next;
    local_28 = &local_40->next;
  }
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*const,_sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>,_false,_false>
                         *)0x481164);
  *local_28 = ppVar3->second;
  return local_20[0];
}

Assistant:

Hypothesis *CloneHypAndDependents(
    const Hypothesis *to_clone,
    absl::flat_hash_map<const Hypothesis *, Hypothesis *> *clone_map,
    model::FreeList<Hypothesis> *allocator) {
  Hypothesis *cloned = nullptr;
  Hypothesis **result_callback = &cloned;

  // Iteratively clone "to_clone" and its dependencies.
  // The new pointer will be written back to *result_callback.
  while (to_clone != nullptr) {
    // If "to_clone" has already been cloned before, we just look up the result.
    auto iter = clone_map->find(to_clone);
    if (iter != clone_map->end()) {
      *result_callback = iter->second;
      break;
    }

    // Allocate a new Hypothesis and copy the values.
    Hypothesis *new_hyp = allocator->Allocate();
    *new_hyp = *to_clone;
    *result_callback = new_hyp;
    clone_map->insert({to_clone, new_hyp});

    // Move on to clone "to_clone->next".
    to_clone = to_clone->next;
    result_callback = &(new_hyp->next);
  }
  return cloned;
}